

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

int pt_blk_proceed_to_disabled
              (pt_block_decoder *decoder,pt_block *block,pt_insn *insn,pt_insn_ext *iext,
              pt_event *ev)

{
  pt_config *ppVar1;
  pt_config *config;
  pt_event *ev_local;
  pt_insn_ext *iext_local;
  pt_insn *insn_local;
  pt_block *block_local;
  pt_block_decoder *decoder_local;
  
  if (((decoder == (pt_block_decoder *)0x0) || (block == (pt_block *)0x0)) ||
     (ev == (pt_event *)0x0)) {
    decoder_local._4_4_ = -1;
  }
  else if ((ev->field_0x4 & 1) == 0) {
    decoder_local._4_4_ = pt_blk_proceed_to_ip(decoder,block,insn,iext,(ev->variant).enabled.ip);
  }
  else {
    ppVar1 = pt_blk_config(decoder);
    if (ppVar1 == (pt_config *)0x0) {
      decoder_local._4_4_ = -1;
    }
    else if (((ppVar1->addr_filter).config.addr_cfg == 0) ||
            ((*(ushort *)&ppVar1->errata >> 5 & 1) == 0)) {
      decoder_local._4_4_ = pt_blk_proceed_to_insn(decoder,block,insn,iext,pt_insn_changes_cr3);
    }
    else {
      decoder_local._4_4_ = pt_blk_proceed_skl014(decoder,block,insn,iext);
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_blk_proceed_to_disabled(struct pt_block_decoder *decoder,
				      struct pt_block *block,
				      struct pt_insn *insn,
				      struct pt_insn_ext *iext,
				      const struct pt_event *ev)
{
	if (!decoder || !block || !ev)
		return -pte_internal;

	if (ev->ip_suppressed) {
		const struct pt_config *config;

		config = pt_blk_config(decoder);
		if (!config)
			return -pte_internal;

		/* Due to SKL014 the TIP.PGD payload may be suppressed also for
		 * direct branches.
		 *
		 * If we don't have a filter configuration we assume that no
		 * address filters were used and the erratum does not apply.
		 *
		 * We might otherwise disable tracing too early.
		 */
		if (config->addr_filter.config.addr_cfg &&
		    config->errata.skl014)
			return pt_blk_proceed_skl014(decoder, block, insn,
						     iext);

		/* A synchronous disabled event also binds to far branches and
		 * CPL-changing instructions.  Both would require trace,
		 * however, and are thus implicitly handled by erroring out.
		 *
		 * The would-require-trace error is handled by our caller.
		 */
		return pt_blk_proceed_to_insn(decoder, block, insn, iext,
					      pt_insn_changes_cr3);
	} else
		return pt_blk_proceed_to_ip(decoder, block, insn, iext,
					    ev->variant.disabled.ip);
}